

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

void __thiscall QVariant::save(QVariant *this,QDataStream *s)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  QDataStream *in_RSI;
  long in_FS_OFFSET;
  char *typeName;
  int i;
  bool saveAsUserType;
  quint32 typeId;
  undefined4 in_stack_fffffffffffffee8;
  quint32 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  QMetaTypeInterface *in_stack_fffffffffffffef8;
  QDataStream *in_stack_ffffffffffffff00;
  QMetaType *in_stack_ffffffffffffff08;
  char *local_c8;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  uint in_stack_ffffffffffffff58;
  uint uVar6;
  uint uVar7;
  QMetaType local_88;
  QMessageLogger local_80;
  QMetaTypeInterface *local_60;
  QMetaType local_40;
  QMetaType local_38;
  QMetaTypeInterface *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (QMetaTypeInterface *)
             Private::type((Private *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
  ;
  uVar3 = QMetaType::id((QMetaType *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffeec);
  uVar6 = in_stack_ffffffffffffff58 & 0xffffff;
  if (0xffff < uVar3) {
    uVar3 = 0x10000;
    uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffff58);
  }
  iVar4 = QDataStream::version(in_RSI);
  if (iVar4 < 0x14) {
    if (uVar3 == 0x10000) {
      uVar3 = 0x400;
      local_38 = Private::type((Private *)
                               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      pcVar5 = QMetaType::name(&local_38);
      iVar4 = strcmp(pcVar5,"QRegExp");
      if (iVar4 == 0) {
        uVar3 = 0x1b;
      }
    }
    else if ((uVar3 < 0x38) || (0x3f < uVar3)) {
      if ((uVar3 < 0x1000) || (0x1017 < uVar3)) {
        if (uVar3 == 0x2000) {
          uVar3 = 0x79;
        }
      }
      else {
        uVar3 = uVar3 - 0xfc0;
        if (0x57 < uVar3) {
          uVar3 = 0x400;
          uVar6 = CONCAT13(1,(int3)uVar6);
        }
      }
    }
    else {
      uVar3 = 0x400;
      uVar6 = CONCAT13(1,(int3)uVar6);
    }
  }
  iVar4 = QDataStream::version(in_RSI);
  if (iVar4 < 7) {
    in_stack_ffffffffffffff54 = 0;
    while ((uVar7 = uVar3, (int)in_stack_ffffffffffffff54 < 0x24 &&
           (uVar7 = in_stack_ffffffffffffff54,
           mapIdFromQt3ToCurrent[(int)in_stack_ffffffffffffff54] != uVar3))) {
      in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1;
    }
    if (0x23 < (int)in_stack_ffffffffffffff54) {
      QVariant((QVariant *)0x437197);
      ::operator<<((QDataStream *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (QVariant *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      ~QVariant((QVariant *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      goto LAB_00437476;
    }
  }
  else {
    iVar4 = QDataStream::version(in_RSI);
    uVar7 = uVar3;
    if (iVar4 < 0xd) {
      if (uVar3 == 0x400) {
        uVar6 = CONCAT13(1,(int3)uVar6);
        uVar7 = 0x7f;
      }
      else if ((uVar3 < 0x1f) || (0x37 < uVar3)) {
        if (uVar3 == 0x79) {
          uVar7 = 0x4b;
        }
        else if ((uVar3 < 0x4b) || (0x55 < uVar3)) {
          if ((0x55 < uVar3) || (uVar3 == 0x1e)) {
            uVar7 = 0x7f;
            uVar6 = CONCAT13(1,(int3)uVar6);
          }
        }
        else {
          uVar7 = uVar3 + 1;
        }
      }
      else {
        uVar7 = uVar3 + 0x61;
      }
    }
  }
  local_c8 = (char *)0x0;
  if ((uVar6 & 0x1000000) != 0) {
    iVar4 = QDataStream::version(in_RSI);
    if (iVar4 < 0x14) {
      Private::type((Private *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_c8 = QtMetaTypePrivate::typedefNameForType(in_stack_fffffffffffffef8);
    }
    if (local_c8 == (char *)0x0) {
      local_40 = Private::type((Private *)
                               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_c8 = QMetaType::name(&local_40);
    }
  }
  QDataStream::operator<<
            ((QDataStream *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffeec);
  iVar4 = QDataStream::version(in_RSI);
  if (7 < iVar4) {
    QDataStream::operator<<
              ((QDataStream *)in_stack_fffffffffffffef8,
               (qint8)((uint)in_stack_fffffffffffffef4 >> 0x18));
  }
  if (local_c8 != (char *)0x0) {
    QDataStream::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
  }
  bVar2 = isValid((QVariant *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if (bVar2) {
    local_60 = (QMetaTypeInterface *)
               Private::type((Private *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    constData((QVariant *)0x4373e1);
    bVar2 = QMetaType::save(in_stack_ffffffffffffff08,in_RSI,in_stack_fffffffffffffef8);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RSI,(char *)in_stack_fffffffffffffef8,
                 in_stack_fffffffffffffef4,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      local_88 = Private::type((Private *)
                               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      pcVar5 = QMetaType::name(&local_88);
      Private::type((Private *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      uVar3 = QMetaType::id((QMetaType *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffeec);
      QMessageLogger::warning
                (&local_80,"QVariant::save: unable to save type \'%s\' (type id: %d).\n",pcVar5,
                 (ulong)uVar3);
    }
  }
  else {
    iVar4 = QDataStream::version(in_RSI);
    if (iVar4 < 0xd) {
      QString::QString((QString *)0x437372);
      ::operator<<((QDataStream *)CONCAT44(uVar7,uVar6),
                   (QString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      QString::~QString((QString *)0x437390);
    }
  }
LAB_00437476:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariant::save(QDataStream &s) const
{
    quint32 typeId = d.type().id();
    bool saveAsUserType = false;
    if (typeId >= QMetaType::User) {
        typeId = QMetaType::User;
        saveAsUserType = true;
    }
    if (s.version() < QDataStream::Qt_6_0) {
        // map to Qt 5 values
        if (typeId == QMetaType::User) {
            typeId = Qt5UserType;
            if (!strcmp(d.type().name(), "QRegExp")) {
                typeId = 27; // QRegExp in Qt 4/5
            }
        } else if (typeId > Qt5LastCoreType && typeId <= QMetaType::LastCoreType) {
            // the type didn't exist in Qt 5
            typeId = Qt5UserType;
            saveAsUserType = true;
        } else if (typeId >= QMetaType::FirstGuiType && typeId <= QMetaType::LastGuiType) {
            typeId -= Qt6ToQt5GuiTypeDelta;
            if (typeId > Qt5LastGuiType) {
                typeId = Qt5UserType;
                saveAsUserType = true;
            }
        } else if (typeId == QMetaType::QSizePolicy) {
            typeId = Qt5SizePolicy;
        }
    }
    if (s.version() < QDataStream::Qt_4_0) {
        int i;
        for (i = 0; i <= MapFromThreeCount - 1; ++i) {
            if (mapIdFromQt3ToCurrent[i] == typeId) {
                typeId = i;
                break;
            }
        }
        if (i >= MapFromThreeCount) {
            s << QVariant();
            return;
        }
    } else if (s.version() < QDataStream::Qt_5_0) {
        if (typeId == Qt5UserType) {
            typeId = 127; // QVariant::UserType had this value in Qt4
            saveAsUserType = true;
        } else if (typeId >= 128 - 97 && typeId <= Qt5LastCoreType) {
            // In Qt4 id == 128 was FirstExtCoreType. In Qt5 ExtCoreTypes set was merged to CoreTypes
            // by moving all ids down by 97.
            typeId += 97;
        } else if (typeId == Qt5SizePolicy) {
            typeId = 75;
        } else if (typeId >= Qt5KeySequence && typeId <= Qt5QQuaternion) {
            // and as a result these types received lower ids too
            typeId += 1;
        } else if (typeId > Qt5QQuaternion || typeId == QMetaType::QUuid) {
            // These existed in Qt 4 only as a custom type
            typeId = 127;
            saveAsUserType = true;
        }
    }
    const char *typeName = nullptr;
    if (saveAsUserType) {
        if (s.version() < QDataStream::Qt_6_0)
            typeName = QtMetaTypePrivate::typedefNameForType(d.type().d_ptr);
        if (!typeName)
            typeName = d.type().name();
    }
    s << typeId;
    if (s.version() >= QDataStream::Qt_4_2)
        s << qint8(d.is_null);
    if (typeName)
        s << typeName;

    if (!isValid()) {
        if (s.version() < QDataStream::Qt_5_0)
            s << QString();
        return;
    }

    if (!d.type().save(s, constData())) {
        qWarning("QVariant::save: unable to save type '%s' (type id: %d).\n",
                 d.type().name(), d.type().id());
        Q_ASSERT_X(false, "QVariant::save", "Invalid type to save");
    }
}